

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O3

char * __thiscall
google::protobuf::internal::EpsCopyInputStream::SkipFallback
          (EpsCopyInputStream *this,char *ptr,int size)

{
  LogMessage *other;
  int iVar1;
  int iVar2;
  pair<const_char_*,_bool> pVar3;
  LogMessage local_70;
  LogFinisher local_31;
  
  iVar1 = (*(int *)&this->buffer_end_ - (int)ptr) + 0x10;
  do {
    iVar2 = size - iVar1;
    if (iVar2 == 0 || size < iVar1) {
      LogMessage::LogMessage
                (&local_70,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/parse_context.h"
                 ,0x12a);
      other = LogMessage::operator<<(&local_70,"CHECK failed: size > chunk_size: ");
      LogFinisher::operator=(&local_31,other);
      LogMessage::~LogMessage(&local_70);
    }
    if (this->limit_ == 0x10) {
      return (char *)0x0;
    }
    pVar3 = DoneFallback(this,ptr + iVar1,-1);
    ptr = pVar3.first;
    if (((undefined1  [16])pVar3 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      return (char *)0x0;
    }
    iVar1 = (*(int *)&this->buffer_end_ - (int)pVar3.first) + 0x10;
    size = iVar2;
  } while (iVar1 < iVar2);
  return ptr + iVar2;
}

Assistant:

const char* EpsCopyInputStream::SkipFallback(const char* ptr, int size) {
  return AppendSize(ptr, size, [](const char* p, int s) {});
}